

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::RobustnessTestCase::Params::Params
          (Params *this,string *name,string *description,ContextResetType *contextResetType,
          ShaderType *shaderType)

{
  ShaderType *shaderType_local;
  ContextResetType *contextResetType_local;
  string *description_local;
  string *name_local;
  Params *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)description);
  this->m_contextResetType = *contextResetType;
  this->m_shaderType = *shaderType;
  return;
}

Assistant:

RobustnessTestCase::Params::Params (const string&				name,
									const string&				description,
									const ContextResetType&		contextResetType,
									const ShaderType&			shaderType)
	: m_name				(name)
	, m_description			(description)
	, m_contextResetType	(contextResetType)
	, m_shaderType			(shaderType)
{
}